

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzgeoelrefless.h.h
# Opt level: O0

void __thiscall
TPZGeoElRefLess<pzgeom::TPZGeoBlend<pzgeom::TPZGeoPoint>_>::Read
          (TPZGeoElRefLess<pzgeom::TPZGeoBlend<pzgeom::TPZGeoPoint>_> *this,TPZStream *buf,
          void *context)

{
  TPZStream *in_RDX;
  TPZGeoBlend<pzgeom::TPZGeoPoint> *in_RSI;
  long in_RDI;
  void *unaff_retaddr;
  TPZStream *in_stack_00000008;
  uint i;
  undefined4 in_stack_ffffffffffffffe0;
  undefined4 in_stack_ffffffffffffffe4;
  int iVar1;
  
  TPZGeoEl::Read((TPZGeoEl *)context,in_stack_00000008,unaff_retaddr);
  pzgeom::TPZGeoBlend<pzgeom::TPZGeoPoint>::Read
            (in_RSI,in_RDX,(void *)CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0));
  for (iVar1 = 0; iVar1 == 0; iVar1 = iVar1 + 1) {
    (**(code **)(*(long *)(in_RDI + 0x210) + 0x30))((long *)(in_RDI + 0x210),in_RSI,in_RDX);
  }
  return;
}

Assistant:

void TPZGeoElRefLess<TGeo>::Read(TPZStream &buf, void *context){
    TPZGeoEl::Read(buf,context);
    fGeo.Read(buf,context);
    for (unsigned int i = 0; i < TGeo::NSides; ++i) {
        this->fNeighbours[i].Read(buf, context);
    }
}